

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_write_resp_hds(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  dynbuf *s;
  undefined1 *puVar1;
  uint uVar2;
  connectdata *conn;
  bool bVar3;
  CURLcode CVar4;
  statusline sVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  CURLcode unaff_EBP;
  char cVar9;
  size_t local_38;
  
  if (((data->req).field_0xd1 & 1) == 0) {
    *pconsumed = 0;
    unaff_EBP = CURLE_OK;
  }
  else {
    conn = data->conn;
    *pconsumed = 0;
    s = &(data->state).headerb;
    bVar3 = false;
    do {
      if ((blen == 0) || (((data->req).field_0xd1 & 1) == 0)) goto LAB_0013a56f;
      pvVar6 = memchr(buf,10,blen);
      if (pvVar6 == (void *)0x0) {
        CVar4 = Curl_dyn_addn(s,buf,blen);
        cVar9 = '\x01';
        if (CVar4 != CURLE_OK) goto LAB_0013a311;
        *pconsumed = *pconsumed + blen;
        if ((data->req).headerline == 0) {
          pcVar8 = Curl_dyn_ptr(s);
          sVar7 = Curl_dyn_len(s);
          sVar5 = checkprotoprefix(data,conn,pcVar8,sVar7);
          if (sVar5 == STATUS_BAD) {
            puVar1 = &(data->req).field_0xd1;
            *puVar1 = *puVar1 & 0xfe;
            Curl_conncontrol(conn,2);
            if (((data->req).httpversion < 10) && (((ulong)conn->bits & 0x40) == 0)) {
              if (((data->state).http_neg.field_0x3 & 4) != 0) {
                bVar3 = true;
                goto LAB_0013a3de;
              }
              Curl_failf(data,"Received HTTP/0.9 when not allowed");
              cVar9 = '\x01';
              unaff_EBP = CURLE_UNSUPPORTED_PROTOCOL;
            }
            else {
              Curl_failf(data,"Invalid status line");
              unaff_EBP = CURLE_WEIRD_SERVER_REPLY;
            }
          }
          else {
            cVar9 = '\x04';
          }
        }
        else {
LAB_0013a3de:
          cVar9 = '\x04';
        }
      }
      else {
        local_38 = (long)pvVar6 + (1 - (long)buf);
        CVar4 = Curl_dyn_addn(s,buf,local_38);
        if (CVar4 == CURLE_OK) {
          *pconsumed = *pconsumed + local_38;
          blen = blen - local_38;
          buf = buf + local_38;
          if ((data->req).headerline == 0) {
            pcVar8 = Curl_dyn_ptr(s);
            sVar7 = Curl_dyn_len(s);
            sVar5 = checkprotoprefix(data,conn,pcVar8,sVar7);
            cVar9 = '\0';
            if (sVar5 == STATUS_BAD) {
              Curl_conncontrol(conn,2);
              if (((data->req).httpversion < 10) && (((ulong)conn->bits & 0x40) == 0)) {
                if (((data->state).http_neg.field_0x3 & 4) == 0) {
                  Curl_failf(data,"Received HTTP/0.9 when not allowed");
                  cVar9 = '\x01';
                  unaff_EBP = CURLE_UNSUPPORTED_PROTOCOL;
                }
                else {
                  puVar1 = &(data->req).field_0xd1;
                  *puVar1 = *puVar1 & 0xfe;
                  cVar9 = '\x04';
                  bVar3 = true;
                }
              }
              else {
                Curl_failf(data,"Invalid status line");
                unaff_EBP = CURLE_WEIRD_SERVER_REPLY;
                cVar9 = '\x01';
              }
            }
            if (sVar5 == STATUS_BAD) goto LAB_0013a516;
          }
          pcVar8 = Curl_dyn_ptr(s);
          sVar7 = Curl_dyn_len(s);
          CVar4 = http_rw_hd(data,pcVar8,sVar7,buf,blen,&local_38);
          Curl_dyn_reset(s);
          if (local_38 != 0) {
            blen = blen - local_38;
            buf = buf + local_38;
            *pconsumed = *pconsumed + local_38;
          }
          cVar9 = CVar4 != CURLE_OK;
          if ((bool)cVar9) {
            unaff_EBP = CVar4;
          }
          goto LAB_0013a516;
        }
LAB_0013a311:
        cVar9 = '\x01';
        unaff_EBP = CVar4;
      }
LAB_0013a516:
    } while (cVar9 == '\0');
    if (cVar9 == '\x04') {
LAB_0013a56f:
      unaff_EBP = CURLE_OK;
      if ((((data->req).field_0xd1 & 1) == 0) && (!bVar3)) {
        Curl_dyn_free(s);
      }
    }
    if (unaff_EBP == CURLE_OK) {
      uVar2 = *(uint *)&(data->req).field_0xd1;
      unaff_EBP = CURLE_OK;
      if ((uVar2 & 1) == 0) {
        unaff_EBP = CURLE_OK;
        if (((uVar2 >> 0x11 & 1) == 0) && (sVar7 = Curl_dyn_len(s), sVar7 != 0)) {
          pcVar8 = Curl_dyn_ptr(s);
          sVar7 = Curl_dyn_len(s);
          unaff_EBP = Curl_client_write(data,1,pcVar8,sVar7);
        }
        Curl_dyn_free(s);
      }
    }
  }
  return unaff_EBP;
}

Assistant:

CURLcode Curl_http_write_resp_hds(struct Curl_easy *data,
                                  const char *buf, size_t blen,
                                  size_t *pconsumed)
{
  if(!data->req.header) {
    *pconsumed = 0;
    return CURLE_OK;
  }
  else {
    CURLcode result;

    result = http_parse_headers(data, buf, blen, pconsumed);
    if(!result && !data->req.header) {
      if(!data->req.no_body && Curl_dyn_len(&data->state.headerb)) {
        /* leftover from parsing something that turned out not
         * to be a header, only happens if we allow for
         * HTTP/0.9 like responses */
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   Curl_dyn_ptr(&data->state.headerb),
                                   Curl_dyn_len(&data->state.headerb));
      }
      Curl_dyn_free(&data->state.headerb);
    }
    return result;
  }
}